

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::StartQueueTrackedObject(Recycler *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  
  if (this->queueTrackedObject == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8e6,"(!this->queueTrackedObject)","!this->queueTrackedObject");
    if (!bVar3) goto LAB_0026a2cc;
    *puVar1 = 0;
  }
  bVar3 = HasPendingTrackObjects(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8e7,"(!this->HasPendingTrackObjects())","!this->HasPendingTrackObjects()")
    ;
    if (!bVar3) goto LAB_0026a2cc;
    *puVar1 = 0;
  }
  if ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next !=
      &this->clientTrackedObjectList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8e9,"(this->clientTrackedObjectList.Empty())",
                       "this->clientTrackedObjectList.Empty()");
    if (!bVar3) goto LAB_0026a2cc;
    *puVar1 = 0;
  }
  if (this->inPartialCollectMode == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8ea,"(!this->inPartialCollectMode)","!this->inPartialCollectMode");
    if (!bVar3) {
LAB_0026a2cc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  this->queueTrackedObject = true;
  return;
}

Assistant:

void
Recycler::StartQueueTrackedObject()
{
    Assert(!this->queueTrackedObject);
    Assert(!this->HasPendingTrackObjects());
#if ENABLE_PARTIAL_GC
    Assert(this->clientTrackedObjectList.Empty());
    Assert(!this->inPartialCollectMode);
#endif
    this->queueTrackedObject = true;
}